

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O2

Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
* __thiscall
Kernel::normalizeSpecializedFractional<Kernel::NumTraits<Kernel::RationalConstantType>>
          (Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           *__return_storage_ptr__,Kernel *this,Interpretation i,NormalizationResult *ts,
          bool *simplified)

{
  undefined4 in_register_00000014;
  
  if ((int)this == 0x2b) {
    normalizeDiv<Kernel::NumTraits<Kernel::RationalConstantType>>
              (__return_storage_ptr__,(Kernel *)CONCAT44(in_register_00000014,i),
               (NormalizationResult *)((Kernel *)CONCAT44(in_register_00000014,i) + 0x34),ts,
               simplified);
  }
  else {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0x1c) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0x24) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0xc) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0x14) = 0;
    *(undefined8 *)
     &__return_storage_ptr__->
      super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
         = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             )._elem._elem + 0x2c) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Option<NormalizationResult> normalizeSpecializedFractional(Interpretation i, NormalizationResult* ts, bool& simplified)
{
  switch (i) {
    case NumTraits::divI:
      ASS(ts != nullptr);
      return normalizeDiv<NumTraits>(ts[0], ts[1], simplified);
    default:
      return Option<NormalizationResult>();
  }
}